

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::cpp_unittest::MovableMessageTest_MoveAssignmentOperator_Test::
MovableMessageTest_MoveAssignmentOperator_Test(MovableMessageTest_MoveAssignmentOperator_Test *this)

{
  MovableMessageTest_MoveAssignmentOperator_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__MovableMessageTest_MoveAssignmentOperator_Test_02a03078;
  return;
}

Assistant:

TEST(MovableMessageTest, MoveAssignmentOperator) {
  proto2_unittest::TestAllTypes message1;
  TestUtil::SetAllFields(&message1);
  const auto* nested = &message1.optional_nested_message();

  proto2_unittest::TestAllTypes message2;
  message2 = std::move(message1);
  TestUtil::ExpectAllFieldsSet(message2);

  // Check if the optional_nested_message was actually moved (and not just
  // copied).
  EXPECT_EQ(nested, &message2.optional_nested_message());
  EXPECT_NE(nested, &message1.optional_nested_message());
}